

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spi.cpp
# Opt level: O2

void __thiscall Spi::set_gpio(Spi *this,int slavesel_b,int creset_b)

{
  uint8_t data;
  uint8_t uVar1;
  
  uVar1 = (slavesel_b != 0) * '\x10';
  data = uVar1 + 0x80;
  if (creset_b == 0) {
    data = uVar1;
  }
  send_byte(this,0x80);
  send_byte(this,data);
  send_byte(this,0x93);
  return;
}

Assistant:

void Spi::set_gpio(int slavesel_b, int creset_b) {
	uint8_t gpio = 0;

	if (slavesel_b) {
		// ADBUS4 (GPIOL0)
		gpio |= 0x10;
	}

	if (creset_b) {
		// ADBUS7 (GPIOL3)
		gpio |= 0x80;
	}

	send_byte(MC_SETB_LOW);
	send_byte(gpio); /* Value */
	send_byte(0x93); /* Direction */
}